

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

char * upb_EncodeStatus_String(upb_EncodeStatus status)

{
  if (status < 4) {
    return &DAT_0013f4d4 + *(int *)(&DAT_0013f4d4 + (ulong)status * 4);
  }
  return "Unknown encode status";
}

Assistant:

const char* upb_EncodeStatus_String(upb_EncodeStatus status) {
  switch (status) {
    case kUpb_EncodeStatus_Ok:
      return "Ok";
    case kUpb_EncodeStatus_MissingRequired:
      return "Missing required field";
    case kUpb_EncodeStatus_MaxDepthExceeded:
      return "Max depth exceeded";
    case kUpb_EncodeStatus_OutOfMemory:
      return "Arena alloc failed";
    default:
      return "Unknown encode status";
  }
}